

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChConveyor.cpp
# Opt level: O1

void __thiscall chrono::ChConveyor::ArchiveIN(ChConveyor *this,ChArchiveIn *marchive)

{
  ChFunctorArchiveInSpecificPtr<chrono::ChBody> specFuncA;
  char *local_58;
  double *local_50;
  undefined1 local_48;
  undefined **local_40;
  ChLinkLockLock **local_38;
  
  ChArchiveIn::VersionRead<chrono::ChConveyor>(marchive);
  ChPhysicsItem::ArchiveIN(&this->super_ChPhysicsItem,marchive);
  local_50 = &this->conveyor_speed;
  local_58 = "conveyor_speed";
  local_48 = 0;
  (**(code **)(*(long *)marchive + 0x20))(marchive,&local_58);
  local_38 = (ChLinkLockLock **)&this->conveyor_truss;
  local_40 = &PTR__ChFunctorArchiveIn_00b38bd8;
  local_58 = "conveyor_truss";
  local_48 = 0;
  local_50 = (double *)&local_40;
  (**(code **)(*(long *)marchive + 0x68))(marchive,&local_58);
  local_38 = (ChLinkLockLock **)&this->conveyor_plate;
  local_40 = &PTR__ChFunctorArchiveIn_00b38bd8;
  local_58 = "conveyor_plate";
  local_48 = 0;
  local_50 = (double *)&local_40;
  (**(code **)(*(long *)marchive + 0x68))(marchive,&local_58);
  local_38 = &this->internal_link;
  local_40 = &PTR__ChFunctorArchiveIn_00b38c40;
  local_58 = "internal_link";
  local_48 = 0;
  local_50 = (double *)&local_40;
  (**(code **)(*(long *)marchive + 0x68))(marchive,&local_58);
  return;
}

Assistant:

void ChConveyor::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChConveyor>();

    // deserialize parent class
    ChPhysicsItem::ArchiveIN(marchive);

    // stream in all member data:
    marchive >> CHNVP(conveyor_speed);
    marchive >> CHNVP(conveyor_truss);
    marchive >> CHNVP(conveyor_plate);
    marchive >> CHNVP(internal_link);
}